

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall
TopologicalSortTest_TwoChains_Test::TestBody(TopologicalSortTest_TwoChains_Test *this)

{
  allocator<unsigned_int> *this_00;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_05;
  bool bVar1;
  reference pvVar2;
  char *message;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_428;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar;
  uint local_388 [4];
  iterator local_378;
  size_type local_370;
  allocator<unsigned_int> local_361;
  uint local_360 [4];
  iterator local_350;
  size_type local_348;
  allocator<unsigned_int> local_339;
  uint local_338 [4];
  iterator local_328;
  size_type local_320;
  allocator<unsigned_int> local_311;
  uint local_310 [4];
  iterator local_300;
  size_type local_2f8;
  allocator<unsigned_int> local_2e9;
  uint local_2e8 [4];
  iterator local_2d8;
  size_type local_2d0;
  allocator<unsigned_int> local_2c1;
  uint local_2c0 [4];
  iterator local_2b0;
  size_type local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  undefined1 local_208 [24];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  expected;
  TopologicalOrdersImpl<std::monostate> local_158;
  undefined1 local_e8 [8];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  results;
  TopologicalOrders orders;
  value_type_conflict2 local_40 [5];
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_29;
  undefined1 local_28 [8];
  Graph_conflict graph;
  TopologicalSortTest_TwoChains_Test *this_local;
  
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_29);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_28,4,&local_29);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_29);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_28,0);
  local_40[0] = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar2,local_40);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_28,1);
  orders.selectors.
  super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (pvVar2,(value_type_conflict2 *)
                    ((long)&orders.selectors.
                            super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count,(Graph_conflict *)local_28);
  ::wasm::TopologicalOrdersImpl<std::monostate>::begin
            (&local_158,
             (TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            ((TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::set<wasm::TopologicalOrdersImpl<std::monostate>>
            ((set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)local_e8,&local_158,
             (TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_158);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 1;
  local_2c0[0] = 0;
  local_2c0[1] = 1;
  local_2c0[2] = 2;
  local_2c0[3] = 3;
  local_2b0 = local_2c0;
  local_2a8 = 4;
  local_2a0 = &local_298;
  std::allocator<unsigned_int>::allocator(&local_2c1);
  __l_04._M_len = local_2a8;
  __l_04._M_array = local_2b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_298,__l_04,&local_2c1);
  local_2e8[0] = 0;
  local_2e8[1] = 1;
  local_2e8[2] = 3;
  local_2e8[3] = 2;
  local_2d8 = local_2e8;
  local_2d0 = 4;
  local_2a0 = &local_280;
  std::allocator<unsigned_int>::allocator(&local_2e9);
  __l_03._M_len = local_2d0;
  __l_03._M_array = local_2d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_280,__l_03,&local_2e9);
  local_310[0] = 0;
  local_310[1] = 2;
  local_310[2] = 1;
  local_310[3] = 3;
  local_300 = local_310;
  local_2f8 = 4;
  local_2a0 = &local_268;
  std::allocator<unsigned_int>::allocator(&local_311);
  __l_02._M_len = local_2f8;
  __l_02._M_array = local_300;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_268,__l_02,&local_311);
  local_338[0] = 1;
  local_338[1] = 0;
  local_338[2] = 2;
  local_338[3] = 3;
  local_328 = local_338;
  local_320 = 4;
  local_2a0 = &local_250;
  std::allocator<unsigned_int>::allocator(&local_339);
  __l_01._M_len = local_320;
  __l_01._M_array = local_328;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_250,__l_01,&local_339);
  local_360[0] = 1;
  local_360[1] = 0;
  local_360[2] = 3;
  local_360[3] = 2;
  local_350 = local_360;
  local_348 = 4;
  local_2a0 = &local_238;
  std::allocator<unsigned_int>::allocator(&local_361);
  __l_00._M_len = local_348;
  __l_00._M_array = local_350;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_238,__l_00,&local_361);
  local_388[0] = 1;
  local_388[1] = 3;
  local_388[2] = 0;
  local_388[3] = 2;
  local_378 = local_388;
  local_370 = 4;
  this_00 = (allocator<unsigned_int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  local_2a0 = &local_220;
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_370;
  __l._M_array = local_378;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_220,__l,this_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 0;
  local_208._0_8_ = &local_298;
  local_208._8_8_ = (pointer)0x6;
  this_01 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_01);
  __l_05._M_len = local_208._8_8_;
  __l_05._M_array = (iterator)local_208._0_8_;
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)(local_208 + 0x10),__l_05,
        (less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
        ((long)&gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        + 5),this_01);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  local_428 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208;
  do {
    local_428 = local_428 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_428);
  } while (local_428 != &local_298);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::allocator<unsigned_int>::~allocator(&local_361);
  std::allocator<unsigned_int>::~allocator(&local_339);
  std::allocator<unsigned_int>::~allocator(&local_311);
  std::allocator<unsigned_int>::~allocator(&local_2e9);
  std::allocator<unsigned_int>::~allocator(&local_2c1);
  testing::internal::EqHelper::
  Compare<std::set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_3a0,"results","expected",
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_e8,
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)(local_208 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)(local_208 + 0x10));
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)local_e8);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(TopologicalSortTest, TwoChains) {
  Graph graph(4);
  graph[0].push_back(2);
  graph[1].push_back(3);
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{
    {0, 1, 2, 3},
    {0, 1, 3, 2},
    {0, 2, 1, 3},
    {1, 0, 2, 3},
    {1, 0, 3, 2},
    {1, 3, 0, 2},
  };
  EXPECT_EQ(results, expected);
}